

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O2

void __thiscall Assimp::B3DImporter::ReadVRTS(B3DImporter *this)

{
  pointer pVVar1;
  pointer pVVar2;
  int iVar3;
  uint uVar4;
  int i;
  int iVar5;
  uint uVar6;
  B3DImporter *this_00;
  ulong uVar7;
  int j;
  long lVar8;
  float fVar9;
  aiVector3D aVar10;
  float local_68 [4];
  ulong local_58;
  
  iVar3 = ReadInt(this);
  this->_vflags = iVar3;
  iVar3 = ReadInt(this);
  this->_tcsets = iVar3;
  uVar4 = ReadInt(this);
  this->_tcsize = uVar4;
  if ((uVar4 < 5) && ((uint)this->_tcsets < 5)) {
    uVar6 = this->_vflags & 2;
    iVar3 = uVar4 * this->_tcsets * 4;
    uVar4 = iVar3 + 0x18 + uVar6 * 8;
    if ((this->_vflags & 1U) == 0) {
      uVar4 = iVar3 + 0xc + uVar6 * 8;
    }
    local_58 = (ulong)((this->_stack).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish[-1] - this->_pos) / (ulong)uVar4;
    iVar3 = (int)(((long)(this->_vertices).
                         super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->_vertices).
                        super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x38);
    std::vector<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>::resize
              (&this->_vertices,(long)(iVar3 + (int)local_58));
    for (uVar7 = 0; uVar7 != local_58; uVar7 = uVar7 + 1) {
      pVVar1 = (this->_vertices).
               super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar2 = pVVar1 + uVar7 + (long)iVar3;
      pVVar2->bones[0] = '\0';
      pVVar2->bones[1] = '\0';
      pVVar2->bones[2] = '\0';
      pVVar2->bones[3] = '\0';
      pVVar2->weights[0] = 0.0;
      *(float *)((long)(pVVar2->bones + 8) + 0) = 0.0;
      *(float *)((long)(pVVar2->bones + 8) + 4) = 0.0;
      pVVar1[uVar7 + (long)iVar3].weights[3] = 0.0;
      aVar10 = ReadVec3(this);
      pVVar1[uVar7 + (long)iVar3].vertex.x = (float)(int)aVar10._0_8_;
      pVVar1[uVar7 + (long)iVar3].vertex.y = (float)(int)((ulong)aVar10._0_8_ >> 0x20);
      pVVar1[uVar7 + (long)iVar3].vertex.z = aVar10.z;
      uVar4 = this->_vflags;
      if ((uVar4 & 1) != 0) {
        aVar10 = ReadVec3(this);
        pVVar1[uVar7 + (long)iVar3].normal.x = (float)(int)aVar10._0_8_;
        pVVar1[uVar7 + (long)iVar3].normal.y = (float)(int)((ulong)aVar10._0_8_ >> 0x20);
        pVVar1[uVar7 + (long)iVar3].normal.z = aVar10.z;
        uVar4 = this->_vflags;
      }
      if ((uVar4 & 2) != 0) {
        ReadQuat(this);
      }
      for (iVar5 = 0; iVar5 < this->_tcsets; iVar5 = iVar5 + 1) {
        local_68[0] = 0.0;
        local_68[1] = 0.0;
        local_68[2] = 0.0;
        local_68[3] = 0.0;
        for (lVar8 = 0; lVar8 < this->_tcsize; lVar8 = lVar8 + 1) {
          fVar9 = ReadFloat(this);
          local_68[lVar8] = fVar9;
        }
        if (iVar5 == 0) {
          pVVar1[uVar7 + (long)iVar3].texcoords.x = local_68[0];
          pVVar1[uVar7 + (long)iVar3].texcoords.y = 1.0 - local_68[1];
          pVVar1[uVar7 + (long)iVar3].texcoords.z = local_68[2];
        }
      }
    }
    return;
  }
  this_00 = (B3DImporter *)&stack0xffffffffffffffb0;
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffb0,"Bad texcoord data",(allocator *)local_68);
  Fail(this_00,(string *)&stack0xffffffffffffffb0);
}

Assistant:

void B3DImporter::ReadVRTS(){
    _vflags=ReadInt();
    _tcsets=ReadInt();
    _tcsize=ReadInt();
    if( _tcsets<0 || _tcsets>4 || _tcsize<0 || _tcsize>4 ){
        Fail( "Bad texcoord data" );
    }

    int sz=12+(_vflags&1?12:0)+(_vflags&2?16:0)+(_tcsets*_tcsize*4);
    int n_verts=ChunkSize()/sz;

    int v0=static_cast<int>(_vertices.size());
    _vertices.resize( v0+n_verts );

    for( int i=0;i<n_verts;++i ){
        Vertex &v=_vertices[v0+i];

        memset( v.bones,0,sizeof(v.bones) );
        memset( v.weights,0,sizeof(v.weights) );

        v.vertex=ReadVec3();

        if( _vflags & 1 ) v.normal=ReadVec3();

        if( _vflags & 2 ) ReadQuat();	//skip v 4bytes...

        for( int i=0;i<_tcsets;++i ){
            float t[4]={0,0,0,0};
            for( int j=0;j<_tcsize;++j ){
                t[j]=ReadFloat();
            }
            t[1]=1-t[1];
            if( !i ) v.texcoords=aiVector3D( t[0],t[1],t[2] );
        }
    }
}